

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall
leveldb::DBImpl::RecoverLogFile
          (DBImpl *this,uint64_t log_number,bool last_log,bool *save_manifest,VersionEdit *edit,
          SequenceNumber *max_sequence)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  SequenceNumber SVar4;
  char *pcVar5;
  void *pvVar6;
  byte in_CL;
  undefined8 in_RDX;
  long in_RSI;
  Reader *in_RDI;
  undefined1 *in_R8;
  long in_FS_OFFSET;
  ulong *in_stack_00000008;
  SequenceNumber last_seq;
  MemTable *mem;
  int compactions;
  Status *status;
  uint64_t lfile_size;
  Slice record;
  LogReporter reporter;
  SequentialFile *file;
  Reader reader;
  WriteBatch batch;
  string scratch;
  string fname;
  MemTable *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  Reader *in_stack_fffffffffffffd98;
  MemTable *in_stack_fffffffffffffda0;
  Logger *info_log;
  undefined4 in_stack_fffffffffffffda8;
  uint uVar7;
  undefined1 in_stack_fffffffffffffdac;
  undefined1 in_stack_fffffffffffffdad;
  bool bVar8;
  undefined1 in_stack_fffffffffffffdae;
  undefined1 in_stack_fffffffffffffdaf;
  DBImpl *in_stack_fffffffffffffdb0;
  InternalKeyComparator *comparator;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  undefined1 *in_stack_fffffffffffffdc0;
  LogReporter *in_stack_fffffffffffffdc8;
  string *in_stack_fffffffffffffe00;
  undefined5 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0d;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 in_stack_fffffffffffffe0f;
  Reader *pRVar9;
  undefined7 in_stack_fffffffffffffe40;
  byte in_stack_fffffffffffffe47;
  VersionEdit *in_stack_fffffffffffffe48;
  MemTable *mem_00;
  undefined4 in_stack_fffffffffffffe58;
  int iVar10;
  undefined1 local_150 [8];
  undefined1 local_148 [8];
  undefined1 local_140 [8];
  undefined1 local_138 [80];
  undefined8 local_e8;
  undefined8 local_e0;
  char *local_d8;
  Reader *local_d0;
  InternalKeyComparator *local_c8 [20];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar9 = in_RDI;
  port::Mutex::AssertHeld((Mutex *)in_stack_fffffffffffffd78);
  LogFileName(in_stack_fffffffffffffd90,
              CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
  (**(code **)(**(long **)(in_RSI + 8) + 0x10))(in_RDI,*(long **)(in_RSI + 8),local_28,local_c8);
  bVar1 = Status::ok((Status *)in_stack_fffffffffffffd78);
  if (bVar1) {
    RecoverLogFile::LogReporter::LogReporter((LogReporter *)in_stack_fffffffffffffd78);
    local_e8 = *(undefined8 *)(in_RSI + 8);
    local_e0 = *(undefined8 *)(in_RSI + 0x48);
    local_d8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd78);
    if ((*(byte *)(in_RSI + 0x3a) & 1) == 0) {
      in_RDI = (Reader *)0x0;
    }
    local_d0 = in_RDI;
    log::Reader::Reader(in_stack_fffffffffffffd98,(SequentialFile *)in_stack_fffffffffffffd90,
                        (Reporter *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                        (bool)in_stack_fffffffffffffd87,(uint64_t)in_stack_fffffffffffffd78);
    Log(*(Logger **)(in_RSI + 0x48),"Recovering log #%llu",in_RDX);
    std::__cxx11::string::string(in_stack_fffffffffffffd90);
    Slice::Slice((Slice *)in_stack_fffffffffffffd78);
    WriteBatch::WriteBatch((WriteBatch *)in_stack_fffffffffffffd98);
    iVar10 = 0;
    mem_00 = (MemTable *)0x0;
    do {
      do {
        while( true ) {
          in_stack_fffffffffffffe0f =
               log::Reader::ReadRecord
                         (in_RDI,(Slice *)CONCAT17(in_stack_fffffffffffffe0f,
                                                   CONCAT16(in_stack_fffffffffffffe0e,
                                                            CONCAT15(in_stack_fffffffffffffe0d,
                                                                     in_stack_fffffffffffffe08))),
                          in_stack_fffffffffffffe00);
          in_stack_fffffffffffffe0e = false;
          if ((bool)in_stack_fffffffffffffe0f) {
            in_stack_fffffffffffffe0d = Status::ok((Status *)in_stack_fffffffffffffd78);
            in_stack_fffffffffffffe0e = in_stack_fffffffffffffe0d;
          }
          if ((bool)in_stack_fffffffffffffe0e == false) goto LAB_0188c0c5;
          in_stack_fffffffffffffe00 = (string *)Slice::size((Slice *)in_stack_fffffffffffffd78);
          if ((string *)0xb < in_stack_fffffffffffffe00) break;
          Slice::size((Slice *)in_stack_fffffffffffffd78);
          Slice::Slice((Slice *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                       (char *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
          Slice::Slice((Slice *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                       (string *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
          Status::Corruption((Slice *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                             (Slice *)in_stack_fffffffffffffd78);
          RecoverLogFile(unsigned_long,bool,bool*,leveldb::VersionEdit*,unsigned_long*)::LogReporter
          ::Corruption(unsigned_long,leveldb::Status_const__
                    (in_stack_fffffffffffffdc8,(size_t)in_stack_fffffffffffffdc0,
                     (Status *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
          Status::~Status((Status *)in_stack_fffffffffffffd78);
        }
        WriteBatchInternal::SetContents
                  ((WriteBatch *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                   (Slice *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
        if (mem_00 == (MemTable *)0x0) {
          mem_00 = (MemTable *)operator_new(0x70);
          MemTable::MemTable((MemTable *)
                             CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                             (InternalKeyComparator *)in_stack_fffffffffffffdb0);
          MemTable::Ref(in_stack_fffffffffffffd78);
        }
        WriteBatchInternal::InsertInto
                  ((WriteBatch *)
                   CONCAT17(in_stack_fffffffffffffdaf,
                            CONCAT16(in_stack_fffffffffffffdae,
                                     CONCAT15(in_stack_fffffffffffffdad,
                                              CONCAT14(in_stack_fffffffffffffdac,
                                                       in_stack_fffffffffffffda8)))),
                   in_stack_fffffffffffffda0);
        Status::operator=((Status *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                          (Status *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
        Status::~Status((Status *)in_stack_fffffffffffffd78);
        MaybeIgnoreError(in_stack_fffffffffffffdb0,
                         (Status *)
                         CONCAT17(in_stack_fffffffffffffdaf,
                                  CONCAT16(in_stack_fffffffffffffdae,
                                           CONCAT15(in_stack_fffffffffffffdad,
                                                    CONCAT14(in_stack_fffffffffffffdac,
                                                             in_stack_fffffffffffffda8)))));
        bVar1 = Status::ok((Status *)in_stack_fffffffffffffd78);
        if (!bVar1) goto LAB_0188c0c5;
        SVar4 = WriteBatchInternal::Sequence((WriteBatch *)in_stack_fffffffffffffd78);
        iVar3 = WriteBatchInternal::Count((WriteBatch *)in_stack_fffffffffffffd78);
        in_stack_fffffffffffffe48 = (VersionEdit *)((SVar4 + (long)iVar3) - 1);
        if ((VersionEdit *)*in_stack_00000008 < in_stack_fffffffffffffe48) {
          *in_stack_00000008 = (ulong)in_stack_fffffffffffffe48;
        }
        in_stack_fffffffffffffdc8 =
             (LogReporter *)MemTable::ApproximateMemoryUsage(in_stack_fffffffffffffd78);
      } while (in_stack_fffffffffffffdc8 <= *(LogReporter **)(in_RSI + 0x50));
      iVar10 = iVar10 + 1;
      *in_R8 = 1;
      WriteLevel0Table((DBImpl *)CONCAT44(iVar10,in_stack_fffffffffffffe58),mem_00,
                       in_stack_fffffffffffffe48,
                       (Version *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
      in_stack_fffffffffffffdc0 = local_138;
      Status::operator=((Status *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                        (Status *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
      Status::~Status((Status *)in_stack_fffffffffffffd78);
      MemTable::Unref(in_stack_fffffffffffffd78);
      mem_00 = (MemTable *)0x0;
      in_stack_fffffffffffffdbf = Status::ok((Status *)in_stack_fffffffffffffd78);
    } while ((bool)in_stack_fffffffffffffdbf);
LAB_0188c0c5:
    comparator = local_c8[0];
    if (local_c8[0] != (InternalKeyComparator *)0x0) {
      (*(local_c8[0]->super_Comparator)._vptr_Comparator[1])();
      comparator = local_c8[0];
    }
    bVar1 = Status::ok((Status *)in_stack_fffffffffffffd78);
    if ((((bVar1) && ((*(byte *)(in_RSI + 0x84) & 1) != 0)) && ((in_CL & 1) != 0)) && (iVar10 == 0))
    {
      if (*(long *)(in_RSI + 0x148) != 0) {
        __assert_fail("logfile_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                      ,0x1d5,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      if (*(long *)(in_RSI + 0x158) != 0) {
        __assert_fail("log_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                      ,0x1d6,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      if (*(long *)(in_RSI + 0x130) != 0) {
        __assert_fail("mem_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                      ,0x1d7,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      in_stack_fffffffffffffe47 = 0;
      (**(code **)(**(long **)(in_RSI + 8) + 0x58))
                (local_148,*(long **)(in_RSI + 8),local_28,local_140);
      bVar1 = Status::ok((Status *)in_stack_fffffffffffffd78);
      bVar8 = false;
      if (bVar1) {
        (**(code **)(**(long **)(in_RSI + 8) + 0x28))
                  (local_150,*(long **)(in_RSI + 8),local_28,in_RSI + 0x148);
        in_stack_fffffffffffffe47 = 1;
        bVar8 = Status::ok((Status *)in_stack_fffffffffffffd78);
      }
      uVar7 = (uint)bVar8 << 0x18;
      if ((in_stack_fffffffffffffe47 & 1) != 0) {
        Status::~Status((Status *)in_stack_fffffffffffffd78);
      }
      Status::~Status((Status *)in_stack_fffffffffffffd78);
      if ((uVar7 & 0x1000000) != 0) {
        info_log = *(Logger **)(in_RSI + 0x48);
        pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd78);
        Log(info_log,"Reusing old log %s \n",pcVar5);
        pvVar6 = operator_new(0x20);
        log::Writer::Writer((Writer *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                            (WritableFile *)
                            CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                            (uint64_t)in_stack_fffffffffffffd78);
        *(void **)(in_RSI + 0x158) = pvVar6;
        *(undefined8 *)(in_RSI + 0x150) = in_RDX;
        if (mem_00 == (MemTable *)0x0) {
          pvVar6 = operator_new(0x70);
          MemTable::MemTable((MemTable *)
                             CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                             comparator);
          *(void **)(in_RSI + 0x130) = pvVar6;
          MemTable::Ref(in_stack_fffffffffffffd78);
        }
        else {
          *(MemTable **)(in_RSI + 0x130) = mem_00;
          mem_00 = (MemTable *)0x0;
        }
      }
    }
    if (mem_00 != (MemTable *)0x0) {
      uVar2 = Status::ok((Status *)in_stack_fffffffffffffd78);
      if ((bool)uVar2) {
        *in_R8 = 1;
        WriteLevel0Table((DBImpl *)CONCAT44(iVar10,in_stack_fffffffffffffe58),mem_00,
                         in_stack_fffffffffffffe48,
                         (Version *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
        Status::operator=((Status *)CONCAT17(uVar2,in_stack_fffffffffffffd88),
                          (Status *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
        Status::~Status((Status *)in_stack_fffffffffffffd78);
      }
      MemTable::Unref(in_stack_fffffffffffffd78);
    }
    WriteBatch::~WriteBatch((WriteBatch *)in_stack_fffffffffffffd78);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd78);
    log::Reader::~Reader((Reader *)in_stack_fffffffffffffd78);
    RecoverLogFile::LogReporter::~LogReporter((LogReporter *)in_stack_fffffffffffffd78);
  }
  else {
    MaybeIgnoreError(in_stack_fffffffffffffdb0,
                     (Status *)
                     CONCAT17(in_stack_fffffffffffffdaf,
                              CONCAT16(in_stack_fffffffffffffdae,
                                       CONCAT15(in_stack_fffffffffffffdad,
                                                CONCAT14(in_stack_fffffffffffffdac,
                                                         in_stack_fffffffffffffda8)))));
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Status)(char *)pRVar9;
  }
  __stack_chk_fail();
}

Assistant:

Status DBImpl::RecoverLogFile(uint64_t log_number, bool last_log,
                              bool* save_manifest, VersionEdit* edit,
                              SequenceNumber* max_sequence) {
  struct LogReporter : public log::Reader::Reporter {
    Env* env;
    Logger* info_log;
    const char* fname;
    Status* status;  // null if options_.paranoid_checks==false
    void Corruption(size_t bytes, const Status& s) override {
      Log(info_log, "%s%s: dropping %d bytes; %s",
          (this->status == nullptr ? "(ignoring error) " : ""), fname,
          static_cast<int>(bytes), s.ToString().c_str());
      if (this->status != nullptr && this->status->ok()) *this->status = s;
    }
  };

  mutex_.AssertHeld();

  // Open the log file
  std::string fname = LogFileName(dbname_, log_number);
  SequentialFile* file;
  Status status = env_->NewSequentialFile(fname, &file);
  if (!status.ok()) {
    MaybeIgnoreError(&status);
    return status;
  }

  // Create the log reader.
  LogReporter reporter;
  reporter.env = env_;
  reporter.info_log = options_.info_log;
  reporter.fname = fname.c_str();
  reporter.status = (options_.paranoid_checks ? &status : nullptr);
  // We intentionally make log::Reader do checksumming even if
  // paranoid_checks==false so that corruptions cause entire commits
  // to be skipped instead of propagating bad information (like overly
  // large sequence numbers).
  log::Reader reader(file, &reporter, true /*checksum*/, 0 /*initial_offset*/);
  Log(options_.info_log, "Recovering log #%llu",
      (unsigned long long)log_number);

  // Read all the records and add to a memtable
  std::string scratch;
  Slice record;
  WriteBatch batch;
  int compactions = 0;
  MemTable* mem = nullptr;
  while (reader.ReadRecord(&record, &scratch) && status.ok()) {
    if (record.size() < 12) {
      reporter.Corruption(record.size(),
                          Status::Corruption("log record too small", fname));
      continue;
    }
    WriteBatchInternal::SetContents(&batch, record);

    if (mem == nullptr) {
      mem = new MemTable(internal_comparator_);
      mem->Ref();
    }
    status = WriteBatchInternal::InsertInto(&batch, mem);
    MaybeIgnoreError(&status);
    if (!status.ok()) {
      break;
    }
    const SequenceNumber last_seq = WriteBatchInternal::Sequence(&batch) +
                                    WriteBatchInternal::Count(&batch) - 1;
    if (last_seq > *max_sequence) {
      *max_sequence = last_seq;
    }

    if (mem->ApproximateMemoryUsage() > options_.write_buffer_size) {
      compactions++;
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
      mem->Unref();
      mem = nullptr;
      if (!status.ok()) {
        // Reflect errors immediately so that conditions like full
        // file-systems cause the DB::Open() to fail.
        break;
      }
    }
  }

  delete file;

  // See if we should keep reusing the last log file.
  if (status.ok() && options_.reuse_logs && last_log && compactions == 0) {
    assert(logfile_ == nullptr);
    assert(log_ == nullptr);
    assert(mem_ == nullptr);
    uint64_t lfile_size;
    if (env_->GetFileSize(fname, &lfile_size).ok() &&
        env_->NewAppendableFile(fname, &logfile_).ok()) {
      Log(options_.info_log, "Reusing old log %s \n", fname.c_str());
      log_ = new log::Writer(logfile_, lfile_size);
      logfile_number_ = log_number;
      if (mem != nullptr) {
        mem_ = mem;
        mem = nullptr;
      } else {
        // mem can be nullptr if lognum exists but was empty.
        mem_ = new MemTable(internal_comparator_);
        mem_->Ref();
      }
    }
  }

  if (mem != nullptr) {
    // mem did not get reused; compact it.
    if (status.ok()) {
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
    }
    mem->Unref();
  }

  return status;
}